

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_features.c
# Opt level: O3

void av1_set_speed_features_framesize_dependent(AV1_COMP *cpi,int speed)

{
  int *piVar1;
  MODE MVar2;
  byte bVar3;
  byte bVar4;
  _Bool _Var5;
  AV1_PRIMARY *pAVar6;
  SequenceHeader *pSVar7;
  byte bVar8;
  undefined4 uVar9;
  code *pcVar10;
  long lVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  undefined4 uVar15;
  _Bool _Var16;
  int iVar17;
  uint uVar18;
  long lVar19;
  bool bVar20;
  int64_t iVar21;
  BLOCK_SIZE BVar22;
  int iVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  
  MVar2 = (cpi->oxcf).mode;
  if (MVar2 == '\x02') {
    iVar13 = (cpi->common).width;
    iVar17 = (cpi->common).height;
    if (iVar13 < iVar17) {
      iVar17 = iVar13;
    }
    _Var16 = (cpi->oxcf).use_highbitdepth;
    if (iVar17 < 0x1e0) {
      (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_64X64;
      (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\x01';
      if (_Var16 != false) {
        (cpi->sf).tx_sf.prune_tx_size_level = 1;
      }
LAB_00225d5f:
      (cpi->sf).part_sf.ml_partition_search_breakout_thresh[0] = 200;
      (cpi->sf).part_sf.ml_partition_search_breakout_thresh[1] = 0xfa;
      (cpi->sf).part_sf.ml_partition_search_breakout_thresh[2] = 300;
      (cpi->sf).part_sf.ml_partition_search_breakout_thresh[3] = 500;
      (cpi->sf).part_sf.ml_partition_search_breakout_thresh[4] = -1;
      (cpi->sf).part_sf.ml_early_term_after_part_split_level = 1;
      if (0 < speed) {
        (cpi->sf).part_sf.use_square_partition_only_threshold =
             (0x1df < iVar17) * '\x03' + BLOCK_32X32;
        (cpi->sf).part_sf.ml_partition_search_breakout_thresh[3] = 300;
        (cpi->sf).part_sf.ml_early_term_after_part_split_level = 2;
        if (speed != 1) {
          (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_32X32;
          (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x400000;
          (cpi->sf).part_sf.partition_search_breakout_rate_thr = 100;
          if (0x1df < iVar17) goto LAB_00225de1;
          iVar13 = 3;
          goto LAB_00226028;
        }
      }
    }
    else {
      (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_128X128;
      if (iVar17 < 0x2d0) {
        (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\x02';
        goto LAB_00225d5f;
      }
      (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\x03';
      if (0x86f < iVar17) {
        (cpi->sf).part_sf.default_min_partition_size = BLOCK_8X8;
      }
      (cpi->sf).mv_sf.use_downsampled_sad = 2;
      if (speed < 1) goto LAB_0022707c;
      (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_128X128;
      (cpi->sf).part_sf.ml_early_term_after_part_split_level = 2;
      if (speed == 1) goto LAB_0022707c;
      (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_64X64;
      (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x1000000;
      (cpi->sf).part_sf.partition_search_breakout_rate_thr = 0x78;
LAB_00225de1:
      (cpi->sf).tx_sf.tx_type_search.prune_tx_type_using_stats = 1;
      iVar13 = 2;
LAB_00226028:
      if (_Var16 != false) {
        (cpi->sf).tx_sf.prune_tx_size_level = iVar13;
      }
      if (2 < (uint)speed) {
        (cpi->sf).part_sf.ml_early_term_after_part_split_level = 0;
        if (iVar17 < 0x2d0) {
          (cpi->sf).part_sf.max_intra_bsize = BLOCK_32X32;
          iVar13 = 0x78;
          iVar21 = 0x800000;
        }
        else {
          iVar13 = 200;
          iVar21 = 0x2000000;
        }
        (cpi->sf).part_sf.partition_search_breakout_dist_thr = iVar21;
        (cpi->sf).part_sf.partition_search_breakout_rate_thr = iVar13;
        if (_Var16 != false) {
          (cpi->sf).tx_sf.prune_tx_size_level = 3;
        }
        if (speed != 3) {
          if (iVar17 < 0x2d0) {
            (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x1000000;
            if (iVar17 < 0x1e0) {
              if ((5 < (uint)speed) &&
                 ((cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_16X16,
                 7 < (uint)speed)) {
                uVar9 = 2;
                lVar11 = 0x3e0;
                goto LAB_00226861;
              }
            }
            else {
              (cpi->sf).tx_sf.tx_type_search.prune_tx_type_using_stats = 2;
              if ((5 < (uint)speed) &&
                 ((cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_16X16,
                 (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\x01',
                 8 < (uint)speed)) {
LAB_0022687e:
                (cpi->sf).inter_sf.coeff_cost_upd_level = INTERNAL_COST_UPD_OFF;
                (cpi->sf).inter_sf.mode_cost_upd_level = INTERNAL_COST_UPD_OFF;
              }
            }
          }
          else {
            (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x4000000;
            (cpi->sf).tx_sf.tx_type_search.prune_tx_type_using_stats = 2;
            if (5 < (uint)speed) {
              (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\0';
              if (0x437 < iVar17) {
                (cpi->sf).part_sf.default_min_partition_size = BLOCK_8X8;
              }
              (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_16X16;
              if (7 < (uint)speed) {
                uVar9 = 1;
                lVar11 = 0x49c;
LAB_00226861:
                *(undefined4 *)((long)&(cpi->sf).hl_sf.frame_parameter_update + lVar11) = uVar9;
                if (8 < (uint)speed && iVar17 < 0x870) goto LAB_0022687e;
              }
            }
          }
        }
      }
    }
  }
  else {
    if (MVar2 != '\x01') {
      if (MVar2 != '\0') goto LAB_0022707c;
      iVar13 = (cpi->common).width;
      iVar17 = (cpi->common).height;
      if (iVar13 < iVar17) {
        iVar17 = iVar13;
      }
      pAVar6 = cpi->ppi;
      bVar8 = cpi->gf_frame_index;
      bVar3 = (pAVar6->gf_group).update_type[bVar8];
      bVar4 = (cpi->common).current_frame.frame_type;
      bVar24 = (bVar4 & 0xfd) == 0;
      bVar25 = (bVar3 & 0xfe) == 2;
      bVar26 = bVar3 != 6;
      _Var16 = (cpi->oxcf).use_highbitdepth;
      if (iVar17 < 0x1e0) {
        (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_64X64;
        (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\x01';
        if (_Var16 != false) {
          (cpi->sf).tx_sf.prune_tx_size_level = 1;
        }
LAB_00225dfc:
        (cpi->sf).part_sf.ml_partition_search_breakout_thresh[0] = 200;
        (cpi->sf).part_sf.ml_partition_search_breakout_thresh[1] = 0xfa;
        (cpi->sf).part_sf.ml_partition_search_breakout_thresh[2] = 300;
        (cpi->sf).part_sf.ml_partition_search_breakout_thresh[3] = 500;
        (cpi->sf).part_sf.ml_partition_search_breakout_thresh[4] = -1;
        (cpi->sf).part_sf.ml_early_term_after_part_split_level = 1;
        iVar13 = (cpi->oxcf).rc_cfg.under_shoot_pct;
        iVar23 = (cpi->oxcf).rc_cfg.over_shoot_pct;
        if (iVar13 < iVar23) {
          iVar23 = iVar13;
        }
        (cpi->sf).hl_sf.recode_tolerance = (iVar23 >> 2) + 0x19;
      }
      else {
        (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_128X128;
        if (iVar17 < 0x2d0) {
          (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\x02';
          goto LAB_00225dfc;
        }
        (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\x03';
        if (0x86f < iVar17) {
          (cpi->sf).part_sf.default_min_partition_size = BLOCK_8X8;
        }
        (cpi->sf).mv_sf.use_downsampled_sad = 2;
      }
      if (speed < 1) goto LAB_0022707c;
      bVar12 = bVar24 || bVar25;
      _Var5 = (cpi->common).features.allow_screen_content_tools;
      if (iVar17 < 0x1e1) {
        (cpi->sf).inter_sf.skip_newmv_in_drl = 1;
        BVar22 = (0x1df < iVar17) * '\x03' + BLOCK_32X32;
LAB_00225eeb:
        (cpi->sf).part_sf.use_square_partition_only_threshold = BVar22;
        (cpi->sf).part_sf.ml_partition_search_breakout_thresh[0] = 200;
        (cpi->sf).part_sf.ml_partition_search_breakout_thresh[1] = 0xfa;
        (cpi->sf).part_sf.ml_partition_search_breakout_thresh[2] = 300;
        (cpi->sf).part_sf.ml_partition_search_breakout_thresh[3] = 300;
        (cpi->sf).part_sf.ml_partition_search_breakout_thresh[4] = -1;
        (cpi->sf).part_sf.ml_early_term_after_part_split_level = 2;
        (cpi->sf).lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL1;
        if (speed == 1) goto LAB_002264fc;
        (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_32X32;
        (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x400000;
        (cpi->sf).part_sf.partition_search_breakout_rate_thr = 100;
        (cpi->sf).inter_sf.prune_obmc_prob_thresh = 8;
        if (iVar17 < 0x1e0) {
          (cpi->sf).inter_sf.disable_interintra_wedge_var_thresh = 0xffffffff;
          (cpi->sf).inter_sf.skip_ext_comp_nearmv_mode = 1;
          (cpi->sf).inter_sf.limit_inter_mode_cands = (uint)(bVar3 == 1) * 2;
          if (_Var16 != false) {
            (cpi->sf).tx_sf.prune_tx_size_level = 3;
          }
          (cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning = (uint)(!bVar24 && !bVar25);
          (cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch = (uint)(!bVar24 && !bVar25);
LAB_00226299:
          (cpi->sf).mv_sf.disable_second_mv = 1;
          (cpi->sf).mv_sf.auto_mv_step_size = 2;
          (cpi->sf).hl_sf.recode_tolerance = 0x32;
          (cpi->sf).inter_sf.disable_interinter_wedge_newmv_search =
               (uint)(bVar26 && (!bVar24 && !bVar25));
          (cpi->sf).inter_sf.enable_fast_wedge_mask_search = 1;
        }
        else {
          (cpi->sf).inter_sf.disable_interintra_wedge_var_thresh = 100;
          if (iVar17 < 0x1e1) {
            (cpi->sf).inter_sf.skip_ext_comp_nearmv_mode = 1;
          }
          uVar18 = (uint)(bVar3 == 1) * 2;
LAB_00226252:
          (cpi->sf).inter_sf.limit_inter_mode_cands = uVar18;
          (cpi->sf).tx_sf.tx_type_search.prune_tx_type_using_stats = 1;
          if (_Var16 != false) {
            (cpi->sf).tx_sf.prune_tx_size_level = 2;
          }
          if (iVar17 < 0x2d0) goto LAB_00226299;
          (cpi->sf).mv_sf.disable_second_mv = (uint)(!bVar24 && !bVar25) * 2;
          (cpi->sf).mv_sf.auto_mv_step_size = 1;
        }
        if ((uint)speed < 3) goto LAB_002264fc;
        bVar20 = !bVar24 && !bVar25;
        (cpi->sf).inter_sf.enable_fast_wedge_mask_search = 1;
        (cpi->sf).inter_sf.skip_newmv_in_drl = 2;
        (cpi->sf).inter_sf.skip_ext_comp_nearmv_mode = 1;
        (cpi->sf).inter_sf.limit_inter_mode_cands = (uint)(bVar3 == 1) * 3;
        (cpi->sf).inter_sf.disable_interinter_wedge_newmv_search = (uint)bVar20;
        (cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning = 1;
        (cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch = (uint)((bVar4 & 0xfd) != 0);
        (cpi->sf).part_sf.ml_early_term_after_part_split_level = 0;
        if (iVar17 < 0x2d0) {
          uVar18 = (uint)(bVar3 == 1);
          (cpi->sf).part_sf.max_intra_bsize = BLOCK_32X32;
          iVar13 = 0x78;
          iVar21 = 0x800000;
        }
        else {
          uVar18 = (uint)(bVar3 == 1) * 2;
          iVar13 = 200;
          iVar21 = 0x2000000;
        }
        (cpi->sf).part_sf.partition_search_breakout_dist_thr = iVar21;
        (cpi->sf).part_sf.partition_search_breakout_rate_thr = iVar13;
        (cpi->sf).part_sf.skip_non_sq_part_based_on_none = uVar18;
        if (_Var16 != false) {
          (cpi->sf).tx_sf.prune_tx_size_level = 3;
        }
        uVar18 = (uint)bVar20;
        if (iVar17 < 0x1e0) {
          (cpi->sf).part_sf.early_term_after_none_split = 0;
LAB_002264c4:
          (cpi->sf).intra_sf.skip_intra_in_interframe = (uint)bVar20 * 2 + 1;
          (cpi->sf).inter_sf.limit_txfm_eval_per_mode = (uint)bVar20 + (uint)bVar20;
          (cpi->sf).lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL2;
          (cpi->sf).inter_sf.disable_interintra_wedge_var_thresh = 0xffffffff;
          (cpi->sf).inter_sf.disable_interinter_wedge_var_thresh = 0xffffffff;
          if (speed == 3) goto LAB_002264fc;
          (cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning = 2;
          (cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch = 1;
          (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x1000000;
          (cpi->sf).part_sf.early_term_after_none_split = 1;
          if (iVar17 < 0x1e0) {
            (cpi->sf).mv_sf.skip_fullpel_search_using_startmv = uVar18;
            (cpi->sf).inter_sf.prune_obmc_prob_thresh = 0x7fffffff;
            (cpi->sf).inter_sf.skip_newmv_in_drl = 3;
            (cpi->sf).hl_sf.recode_tolerance = 0x37;
            (cpi->sf).intra_sf.skip_intra_in_interframe = 4;
            (cpi->sf).lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL3;
            if (4 < (uint)speed) goto LAB_002267dd;
          }
          else {
            (cpi->sf).tx_sf.tx_type_search.prune_tx_type_using_stats = 2;
            (cpi->sf).inter_sf.prune_obmc_prob_thresh = 0x7fffffff;
            if (iVar17 < 0x1e1) {
              (cpi->sf).inter_sf.skip_newmv_in_drl = 3;
            }
            (cpi->sf).inter_sf.prune_comp_ref_frames = (uint)(bVar26 && (!bVar24 && !bVar25));
            (cpi->sf).hl_sf.recode_tolerance = 0x37;
            (cpi->sf).intra_sf.skip_intra_in_interframe = 4;
            (cpi->sf).lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL3;
            if (4 < (uint)speed) {
              (cpi->sf).inter_sf.prune_warped_prob_thresh = 8;
LAB_002267dd:
              (cpi->sf).inter_sf.prune_comp_ref_frames = 1;
              (cpi->sf).inter_sf.skip_newmv_in_drl = 4;
              (cpi->sf).mv_sf.skip_fullpel_search_using_startmv = uVar18;
              (cpi->sf).inter_sf.mv_cost_upd_level = INTERNAL_COST_UPD_SBROW_SET;
              (cpi->sf).inter_sf.prune_nearest_near_mv_using_refmv_weight =
                   (byte)~(bVar12 | _Var5) & 1;
              (cpi->sf).mv_sf.use_downsampled_sad = 1;
              if (0x1df < iVar17) {
                if (iVar17 < 0x1e1) {
                  (cpi->sf).inter_sf.prune_nearmv_using_neighbors = '\x01';
                }
                else {
                  (cpi->sf).inter_sf.prune_nearmv_using_neighbors = '\x02';
                }
                goto LAB_00226fde;
              }
              (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x4000000;
              (cpi->sf).inter_sf.prune_nearmv_using_neighbors = '\x01';
              goto LAB_00226fe8;
            }
          }
          goto LAB_0022707c;
        }
        (cpi->sf).part_sf.early_term_after_none_split = 1;
        if (iVar17 < 0x2d0) goto LAB_002264c4;
        (cpi->sf).intra_sf.skip_intra_in_interframe = 2 - (uint)bVar12;
        (cpi->sf).inter_sf.limit_txfm_eval_per_mode = (uint)bVar20;
        (cpi->sf).inter_sf.disable_interintra_wedge_var_thresh = 0xffffffff;
        (cpi->sf).inter_sf.disable_interinter_wedge_var_thresh = 100;
        if (speed == 3) goto LAB_002264fc;
        (cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning = 2;
        (cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch = 1;
        (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x4000000;
        (cpi->sf).tx_sf.tx_type_search.prune_tx_type_using_stats = 2;
        (cpi->sf).inter_sf.disable_interinter_wedge_var_thresh = 0xffffffff;
        (cpi->sf).inter_sf.prune_obmc_prob_thresh = 0x7fffffff;
        (cpi->sf).inter_sf.limit_txfm_eval_per_mode = (uint)bVar20 + (uint)bVar20;
        (cpi->sf).inter_sf.prune_comp_ref_frames = 1;
        (cpi->sf).hl_sf.recode_tolerance = 0x20;
        (cpi->sf).intra_sf.skip_intra_in_interframe = 4;
        (cpi->sf).lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL3;
        if ((uint)speed < 5) goto LAB_0022707c;
        (cpi->sf).inter_sf.prune_warped_prob_thresh = 0x10;
        (cpi->sf).hl_sf.recode_tolerance = 0x28;
        (cpi->sf).inter_sf.skip_newmv_in_drl = 4;
        (cpi->sf).mv_sf.skip_fullpel_search_using_startmv = uVar18;
        (cpi->sf).inter_sf.prune_nearmv_using_neighbors = '\x02';
        (cpi->sf).part_sf.ext_part_eval_based_on_cur_best =
             (uint)(byte)(~_Var5 & (bVar4 & 0xfd) != 0);
LAB_00226fde:
        (cpi->sf).tpl_sf.reduce_num_frames = 1;
LAB_00226fe8:
        if ((uint)speed < 6) goto LAB_0022707c;
        (cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning = 4;
        (cpi->sf).inter_sf.prune_nearmv_using_neighbors = '\x03';
        (cpi->sf).inter_sf.prune_comp_ref_frames = 2;
        (cpi->sf).inter_sf.prune_nearest_near_mv_using_refmv_weight = (byte)~(bVar12 | _Var5) & 1;
        (cpi->sf).mv_sf.skip_fullpel_search_using_startmv = uVar18 * 2;
        if (iVar17 < 0x2d0) {
          if (0x1df < iVar17) {
            (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\x01';
            (cpi->sf).hl_sf.allow_sub_blk_me_in_tf = 1;
          }
          (cpi->sf).inter_sf.coeff_cost_upd_level = INTERNAL_COST_UPD_SBROW;
          (cpi->sf).inter_sf.mode_cost_upd_level = INTERNAL_COST_UPD_SBROW;
          (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_16X16;
          (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x4000000;
          (cpi->sf).inter_sf.prune_ref_mv_idx_search = 1;
          uVar9 = 0x96;
          if (!bVar26 || (bVar24 || bVar25)) {
            uVar9 = 0x1c2;
          }
          lVar11 = 800;
        }
        else {
          (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\0';
          (cpi->sf).hl_sf.allow_sub_blk_me_in_tf = 1;
          if (0x437 < iVar17) {
            (cpi->sf).part_sf.default_min_partition_size = BLOCK_8X8;
          }
          (cpi->sf).inter_sf.disable_masked_comp = 1;
          (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_32X32;
          (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x10000000;
          uVar9 = 2;
          lVar11 = 0x218;
        }
        *(undefined4 *)((long)&(cpi->sf).hl_sf.frame_parameter_update + lVar11) = uVar9;
        (cpi->sf).lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL4;
        uVar9 = 0x37;
        lVar11 = 8;
      }
      else {
        BVar22 = BLOCK_64X64;
        if (iVar17 < 0x2d0) goto LAB_00225eeb;
        (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_128X128;
        (cpi->sf).part_sf.ml_early_term_after_part_split_level = 2;
        (cpi->sf).lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL1;
        if (speed != 1) {
          uVar18 = (uint)(bVar3 == 1);
          (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_64X64;
          (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x1000000;
          (cpi->sf).part_sf.partition_search_breakout_rate_thr = 0x78;
          (cpi->sf).inter_sf.prune_obmc_prob_thresh = 0x10;
          (cpi->sf).inter_sf.disable_interintra_wedge_var_thresh = 100;
          goto LAB_00226252;
        }
LAB_002264fc:
        if ((cpi->oxcf).enable_low_complexity_decode == 0) goto LAB_0022707c;
        bVar8 = (pAVar6->gf_group).update_type[bVar8];
        if (iVar17 < 0x260) {
          if (0xee < iVar17 - 0x1e1U) goto LAB_0022707c;
        }
        else {
          uVar18 = 0;
          if ((byte)(bVar8 - 6) < 0xfe) {
            uVar18 = (uint)(1 < (cpi->common).current_frame.pyramid_level);
          }
          (cpi->sf).lpf_sf.skip_loop_filter_using_filt_error = uVar18;
          if (0xee < iVar17 - 0x1e1U) {
            uVar9 = 1;
            lVar11 = 0x88;
            goto LAB_0022657e;
          }
        }
        uVar9 = 1;
        lVar11 = 0x30;
        if ((bVar8 < 6) && ((0x32U >> (bVar8 & 0x1f) & 1) != 0)) {
          (cpi->sf).gm_sf.gm_search_type = '\x04';
        }
      }
LAB_0022657e:
      *(undefined4 *)((long)&(cpi->sf).hl_sf.frame_parameter_update + lVar11) = uVar9;
      goto LAB_0022707c;
    }
    pAVar6 = cpi->ppi;
    bVar8 = (cpi->common).current_frame.frame_type;
    bVar25 = (bVar8 & 0xfd) != 0;
    bVar26 = ((pAVar6->gf_group).update_type[cpi->gf_frame_index] & 0xfe) != 2;
    bVar24 = bVar26 && bVar25;
    uVar18 = (cpi->common).width;
    uVar14 = (cpi->common).height;
    if ((int)uVar18 < (int)uVar14) {
      uVar14 = uVar18;
    }
    if ((int)uVar14 < 0x168) {
      (cpi->sf).rt_sf.prune_intra_mode_based_on_mv_range = BLOCK_4X8;
      (cpi->sf).rt_sf.prune_inter_modes_wrt_gf_arf_based_on_sad = 1;
      if ((speed < 6) ||
         ((cpi->sf).winner_mode_sf.prune_winner_mode_eval_level = (uint)bVar24 * 2, speed == 6))
      goto LAB_0022697f;
      if (speed == 7) {
        (cpi->sf).rt_sf.prefer_large_partition_blocks = 2;
        (cpi->sf).lpf_sf.cdef_pick_method = CDEF_PICK_FROM_Q;
        (cpi->sf).rt_sf.check_only_zero_zeromv_on_large_blocks = true;
        lVar11 = 0x3e0;
        uVar9 = 2;
        lVar19 = 0x4d8;
        uVar15 = 2;
LAB_00226995:
        *(undefined4 *)((long)&(cpi->sf).hl_sf.frame_parameter_update + lVar19) = uVar9;
LAB_0022699d:
        bVar24 = false;
      }
      else {
        (cpi->sf).lpf_sf.cdef_pick_method = CDEF_PICK_FROM_Q;
        (cpi->sf).rt_sf.check_only_zero_zeromv_on_large_blocks = true;
        (cpi->sf).rt_sf.use_rtc_tf = 2;
        if (speed == 8) {
          (cpi->sf).rt_sf.prefer_large_partition_blocks = 1;
          lVar11 = 0x500;
          uVar9 = 1;
          lVar19 = 0x418;
          uVar15 = 1;
          goto LAB_00226995;
        }
        (cpi->sf).rt_sf.use_nonrd_filter_search = 1;
        (cpi->sf).rt_sf.tx_size_level_based_on_qstep = 1;
        (cpi->sf).rt_sf.use_comp_ref_nonrd = 0;
        (cpi->sf).rt_sf.nonrd_aggressive_skip = 1;
        (cpi->sf).rt_sf.skip_intra_pred = 1;
        (cpi->sf).rt_sf.enable_ref_short_signaling = (cpi->sf).rt_sf.use_nonrd_altref_frame == 0;
        (cpi->sf).rt_sf.use_adaptive_subpel_search = false;
        if ((uint)speed < 10) {
LAB_00226983:
          uVar9 = 1;
          uVar15 = 6;
          lVar11 = 0x3a4;
          lVar19 = 0x49c;
          goto LAB_00226995;
        }
        (cpi->sf).rt_sf.skip_intra_pred = 2;
        (cpi->sf).rt_sf.estimate_motion_for_var_based_partition = 0;
        (cpi->sf).rt_sf.hybrid_intra_pickmode = 3;
        (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 2;
        (cpi->sf).rt_sf.reduce_mv_pel_precision_lowcomplex = 1;
        (cpi->sf).rt_sf.use_nonrd_filter_search = 0;
        (cpi->sf).rt_sf.force_large_partition_blocks_intra = 1;
LAB_002266c8:
        (cpi->sf).lpf_sf.cdef_pick_method = CDEF_PICK_FROM_Q;
LAB_002266d2:
        (cpi->sf).rt_sf.nonrd_aggressive_skip = 1;
LAB_002268db:
        if ((uint)speed < 0xb) goto LAB_0022697f;
        bVar24 = true;
        if ((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN) goto LAB_002269a7;
        (cpi->sf).rt_sf.skip_cdef_sb = 1;
        (cpi->sf).rt_sf.selective_cdf_update = 1;
        (cpi->sf).rt_sf.force_only_last_ref = 1;
        (cpi->sf).rt_sf.use_nonrd_filter_search = 0;
        if (0x167 < (int)uVar14) {
          (cpi->sf).part_sf.fixed_partition_size = BLOCK_32X32;
          (cpi->sf).rt_sf.use_fast_fixed_part = 1;
          (cpi->sf).rt_sf.reduce_mv_pel_precision_lowcomplex = 2;
        }
        (cpi->sf).rt_sf.increase_source_sad_thresh = 1;
        (cpi->sf).rt_sf.part_early_exit_zeromv = 2;
        (cpi->sf).rt_sf.set_zeromv_skip_based_on_source_sad = 2;
        uVar15 = 0;
        lVar11 = 0;
        do {
          piVar1 = (cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd + lVar11;
          piVar1[0] = 1;
          piVar1[1] = 1;
          piVar1[2] = 1;
          piVar1[3] = 1;
          lVar11 = lVar11 + 4;
        } while (lVar11 != 0x10);
        bVar24 = true;
        lVar11 = 0x420;
      }
LAB_0022699f:
      *(undefined4 *)((long)&(cpi->sf).hl_sf.frame_parameter_update + lVar11) = uVar15;
    }
    else {
      (cpi->sf).rt_sf.prune_intra_mode_based_on_mv_range = BLOCK_8X4;
      (cpi->sf).intra_sf.skip_filter_intra_in_inter_frames = 1;
      if (5 < speed) {
        if (speed == 6) {
          (cpi->sf).part_sf.disable_8x8_part_based_on_qidx = 1;
          (cpi->sf).rt_sf.skip_newmv_mode_based_on_sse = 2;
          goto LAB_00225d29;
        }
        (cpi->sf).rt_sf.skip_newmv_mode_based_on_sse = 2;
        if (speed != 7) {
          (cpi->sf).rt_sf.use_rtc_tf = 1;
          if (speed == 8) {
            if (pAVar6->use_svc == 0) {
              (cpi->sf).rt_sf.short_circuit_low_temp_var = 0;
              (cpi->sf).rt_sf.use_nonrd_altref_frame = 1;
            }
            (cpi->sf).rt_sf.tx_size_level_based_on_qstep = 2;
            goto LAB_00225d29;
          }
          (cpi->sf).rt_sf.tx_size_level_based_on_qstep = 2;
          (cpi->sf).rt_sf.gf_length_lvl = 1;
          (cpi->sf).rt_sf.skip_cdef_sb = 1;
          (cpi->sf).rt_sf.sad_based_adp_altref_lag = 2;
          (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 2;
          (cpi->sf).rt_sf.use_adaptive_subpel_search = true;
          (cpi->sf).interp_sf.cb_pred_filter_search = 1;
          if (9 < (uint)speed) {
            (cpi->sf).rt_sf.hybrid_intra_pickmode = 2;
            (cpi->sf).rt_sf.sad_based_adp_altref_lag = 4;
            (cpi->sf).rt_sf.tx_size_level_based_on_qstep = 0;
            (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 3;
            (cpi->sf).rt_sf.use_adaptive_subpel_search = false;
            (cpi->sf).interp_sf.cb_pred_filter_search = 2;
            goto LAB_00225d29;
          }
          if ((int)uVar14 < 0x2d0) goto LAB_00226983;
          (cpi->sf).rt_sf.skip_newmv_mode_based_on_sse = 3;
          (cpi->sf).rt_sf.sad_based_adp_altref_lag = 1;
          (cpi->sf).rt_sf.reduce_mv_pel_precision_lowcomplex = 0;
LAB_002268b9:
          if ((int)uVar14 < 0x438) {
            uVar15 = 6;
            lVar11 = 0x3a4;
            goto LAB_0022699d;
          }
LAB_002268c6:
          (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 0;
          (cpi->sf).rt_sf.use_adaptive_subpel_search = false;
          (cpi->sf).interp_sf.cb_pred_filter_search = 0;
          goto LAB_002268db;
        }
        (cpi->sf).rt_sf.prefer_large_partition_blocks = 1;
        if (((uVar14 < 0x2d1) && ((cpi->rc).rtc_external_ratectrl == 0)) &&
           ((cpi->oxcf).use_highbitdepth == false)) {
          (cpi->sf).hl_sf.accurate_bit_estimate = (uint)((cpi->oxcf).q_cfg.aq_mode == '\0');
        }
        (cpi->sf).rt_sf.use_rtc_tf = 1;
        bVar24 = true;
        if (0x1df < (int)uVar14) goto LAB_00225d2b;
        bVar24 = false;
        uVar15 = 2;
        lVar11 = 0x3e0;
        goto LAB_0022699f;
      }
      iVar13 = 0x7fffffff;
      if (bVar26 && bVar25) {
        iVar13 = 0x15e;
      }
      (cpi->sf).tx_sf.tx_type_search.fast_inter_tx_type_prob_thresh = iVar13;
      (cpi->sf).winner_mode_sf.prune_winner_mode_eval_level = (uint)bVar24 * 2;
LAB_00225d29:
      bVar24 = false;
LAB_00225d2b:
      if ((int)uVar14 < 0x2d0) {
        if (8 < speed) {
          (cpi->sf).rt_sf.force_large_partition_blocks_intra = 1;
          (cpi->sf).lpf_sf.cdef_pick_method = CDEF_PICK_FROM_Q;
          if (speed != 9) goto LAB_002266d2;
        }
      }
      else {
        if (speed < 6) {
          if (!bVar24) goto LAB_0022697f;
LAB_002260bd:
          (cpi->sf).rt_sf.prefer_large_partition_blocks = 0;
        }
        else {
          (cpi->sf).rt_sf.skip_newmv_mode_based_on_sse = 3;
          if (bVar24) goto LAB_002260bd;
        }
        if (6 < speed) {
          (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 1;
          (cpi->sf).rt_sf.reduce_mv_pel_precision_lowcomplex = 2;
          if (8 < (uint)speed) {
            (cpi->sf).rt_sf.sad_based_adp_altref_lag = 1;
            (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 2;
            (cpi->sf).rt_sf.reduce_mv_pel_precision_lowcomplex = 0;
            if (speed == 9) goto LAB_002268b9;
            (cpi->sf).rt_sf.sad_based_adp_altref_lag = 3;
            (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 3;
            if ((int)uVar14 < 0x438) goto LAB_002266c8;
            goto LAB_002268c6;
          }
          if (0x437 < (int)uVar14) {
            (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 0;
            (cpi->sf).rt_sf.use_adaptive_subpel_search = false;
          }
        }
      }
LAB_0022697f:
      bVar24 = false;
    }
LAB_002269a7:
    if ((pAVar6->use_svc != 0) || ((pAVar6->rtc_ref).set_ref_frame_config != 0)) {
      iVar13 = (cpi->svc).number_temporal_layers;
      if (((1 < iVar13) && ((cpi->svc).temporal_layer_id == 0)) &&
         (((cpi->svc).spatial_layer_id == 0 ||
          ((cpi->oxcf).frm_dim_cfg.height * (cpi->oxcf).frm_dim_cfg.width < 0x38401)))) {
        (cpi->sf).mv_sf.search_method = '\x01';
        (cpi->sf).mv_sf.subpel_search_method = '\x01';
        (cpi->sf).rt_sf.fullpel_search_step_param = 10;
        (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 0;
        if ((cpi->common).height * (cpi->common).width < 0x18c01) {
          (cpi->sf).rt_sf.nonrd_prune_ref_frame_search = 2;
        }
        (cpi->sf).rt_sf.force_large_partition_blocks_intra = 0;
      }
      if (speed < 8) {
        if (2 < iVar13) goto LAB_00226a97;
LAB_00226aa4:
        _Var16 = true;
      }
      else {
        if (2 < iVar13) {
          (cpi->sf).rt_sf.disable_cdf_update_non_reference_frame = true;
        }
        (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 3;
        if ((pAVar6->rtc_ref).non_reference_frame != 0) {
          (cpi->sf).rt_sf.nonrd_aggressive_skip = 1;
          (cpi->sf).mv_sf.subpel_search_method = '\x02';
        }
        if (9 < (uint)speed || iVar13 < 3) goto LAB_00226aa4;
LAB_00226a97:
        if ((cpi->svc).temporal_layer_id != 0) goto LAB_00226aa4;
        _Var16 = false;
      }
      (cpi->sf).rt_sf.check_only_zero_zeromv_on_large_blocks = _Var16;
      (cpi->sf).rt_sf.frame_level_mode_cost_update = false;
      if ((((pAVar6->rtc_ref).ref_frame_comp[0] == 0) && ((pAVar6->rtc_ref).ref_frame_comp[1] == 0))
         && ((pAVar6->rtc_ref).ref_frame_comp[2] == 0)) {
        uVar18 = 0;
        lVar11 = 0x3f8;
      }
      else {
        (cpi->sf).rt_sf.use_comp_ref_nonrd = 1;
        uVar18 = 0;
        uVar14 = 0;
        if ((pAVar6->rtc_ref).ref_frame_comp[0] != 0) {
          uVar14 = (uint)((pAVar6->rtc_ref).reference[3] != 0);
        }
        (cpi->sf).rt_sf.ref_frame_comp_nonrd[0] = uVar14;
        if ((pAVar6->rtc_ref).ref_frame_comp[1] != 0) {
          uVar18 = (uint)((pAVar6->rtc_ref).reference[1] != 0);
        }
        (cpi->sf).rt_sf.ref_frame_comp_nonrd[1] = uVar18;
        lVar11 = 0x404;
        if ((pAVar6->rtc_ref).ref_frame_comp[2] == 0) {
          uVar18 = 0;
        }
        else {
          uVar18 = (uint)((pAVar6->rtc_ref).reference[6] != 0);
        }
      }
      *(uint *)((long)&(cpi->sf).hl_sf.frame_parameter_update + lVar11) = uVar18;
      if ((1 < iVar13) || (1 < (cpi->svc).number_spatial_layers)) {
        (cpi->sf).hl_sf.accurate_bit_estimate = 0;
      }
      (cpi->sf).rt_sf.estimate_motion_for_var_based_partition = 1;
      if ((pAVar6->rtc_ref).bias_recovery_frame == true) {
        (cpi->sf).mv_sf.search_method = '\x01';
        (cpi->sf).mv_sf.subpel_search_method = '\0';
        (cpi->sf).rt_sf.fullpel_search_step_param = 8;
        (cpi->sf).rt_sf.nonrd_aggressive_skip = 0;
      }
    }
    if ((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN) {
      if (6 < speed) {
        (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 1;
        (cpi->sf).mv_sf.use_bsize_dependent_search_method = 0;
        (cpi->sf).rt_sf.skip_cdef_sb = 1;
        (cpi->sf).rt_sf.increase_color_thresh_palette = true;
        if ((bVar8 & 0xfd) != 0) {
          (cpi->sf).rt_sf.dct_only_palette_nonrd = 1;
        }
        if (speed != 7) {
          (cpi->sf).rt_sf.nonrd_check_partition_merge_mode = 3;
          (cpi->sf).rt_sf.nonrd_prune_ref_frame_search = 1;
          (cpi->sf).rt_sf.use_nonrd_filter_search = 0;
          (cpi->sf).rt_sf.prune_hv_pred_modes_using_src_sad = false;
          if (8 < (uint)speed) {
            (cpi->sf).rt_sf.prune_idtx_nonrd = 1;
            (cpi->sf).rt_sf.part_early_exit_zeromv = 2;
            (cpi->sf).rt_sf.skip_lf_screen = 1;
            (cpi->sf).rt_sf.nonrd_prune_ref_frame_search = 3;
            (cpi->sf).rt_sf.var_part_split_threshold_shift = 10;
            (cpi->sf).mv_sf.subpel_search_method = '\x02';
            (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 3;
            (cpi->sf).rt_sf.reduce_mv_pel_precision_lowcomplex = 1;
            (cpi->sf).lpf_sf.cdef_pick_method = CDEF_PICK_FROM_Q;
            (cpi->sf).rt_sf.nonrd_check_partition_merge_mode = 0;
            (cpi->sf).interp_sf.cb_pred_filter_search = 0;
            if (speed != 9) {
              if (0x1fa400 < (cpi->common).height * (cpi->common).width) {
                (cpi->sf).part_sf.disable_8x8_part_based_on_qidx = 1;
              }
              (cpi->sf).rt_sf.screen_content_cdef_filter_qindex_thresh = 0x50;
              (cpi->sf).rt_sf.nonrd_aggressive_skip = 1;
              (cpi->sf).rt_sf.thresh_active_maps_skip_lf_cdef = 0x5a;
              (cpi->sf).rt_sf.part_early_exit_zeromv = 1;
              (cpi->sf).rt_sf.hybrid_intra_pickmode = 0;
              (cpi->sf).rt_sf.prune_palette_search_nonrd = 1;
              (cpi->sf).rt_sf.dct_only_palette_nonrd = 1;
              (cpi->sf).rt_sf.prune_intra_mode_using_best_sad_so_far = true;
              (cpi->sf).rt_sf.rc_faster_convergence_static = 1;
              (cpi->sf).rt_sf.rc_compute_spatial_var_sc = 1;
            }
          }
        }
      }
      if (bVar24) {
        (cpi->sf).rt_sf.skip_lf_screen = 2;
        (cpi->sf).rt_sf.skip_cdef_sb = 2;
        (cpi->sf).rt_sf.prune_palette_search_nonrd = 2;
        (cpi->sf).rt_sf.increase_color_thresh_palette = false;
        (cpi->sf).rt_sf.prune_h_pred_using_best_mode_so_far = true;
        (cpi->sf).rt_sf.enable_intra_mode_pruning_using_neighbors = true;
      }
      iVar13 = (cpi->rc).high_source_sad;
      iVar17 = iVar13;
      if (0xb < speed) {
        if (iVar13 == 0) {
          iVar17 = 0;
        }
        else if (((40000 < (cpi->rc).frame_source_sad) && ((cpi->rc).prev_avg_source_sad < 1000)) &&
                (0xe0fff < (cpi->oxcf).frm_dim_cfg.height * (cpi->oxcf).frm_dim_cfg.width)) {
          (cpi->sf).rt_sf.prune_palette_search_nonrd = 3;
          (cpi->sf).rt_sf.skip_newmv_mode_sad_screen = 1;
        }
      }
      (cpi->sf).rt_sf.skip_encoding_non_reference_slide_change =
           (uint)(0 < (cpi->oxcf).rc_cfg.drop_frames_water_mark);
      (cpi->sf).rt_sf.higher_thresh_scene_detection = 0;
      (cpi->sf).rt_sf.skip_newmv_flat_blocks_screen = 1;
      (cpi->sf).rt_sf.use_nonrd_altref_frame = 0;
      (cpi->sf).rt_sf.use_comp_ref_nonrd = 0;
      (cpi->sf).rt_sf.use_rtc_tf = 0;
      (cpi->sf).rt_sf.use_idtx_nonrd = 1;
      (cpi->sf).rt_sf.source_metrics_sb_nonrd = 1;
      if (iVar17 == 1) {
        (cpi->sf).rt_sf.prefer_large_partition_blocks = 0;
        (cpi->sf).part_sf.max_intra_bsize = BLOCK_128X128;
        (cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd[0] = 7;
        (cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd[1] = 7;
        (cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd[2] = 7;
        (cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd[3] = 7;
        (cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd[4] = 7;
        (cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd[5] = 7;
        (cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd[6] = 7;
        (cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd[7] = 7;
        (cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd[8] = 7;
        (cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd[9] = 7;
        (cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd[10] = 1;
        (cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd[0xb] = 1;
        (cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd[0xc] = 1;
        (cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd[0xd] = 1;
        (cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd[0xe] = 1;
        (cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd[0xf] = 1;
      }
      if ((bVar24) && ((cpi->rc).high_motion_content_screen_rtc != 0)) {
        (cpi->sf).rt_sf.higher_thresh_scene_detection = 1;
        (cpi->sf).rt_sf.use_nonrd_filter_search = 0;
        (cpi->sf).part_sf.fixed_partition_size = BLOCK_32X32;
        (cpi->sf).rt_sf.use_fast_fixed_part = 1;
        (cpi->sf).rt_sf.increase_source_sad_thresh = 1;
        (cpi->sf).rt_sf.selective_cdf_update = 1;
        (cpi->sf).rt_sf.force_only_last_ref = 1;
        (cpi->sf).mv_sf.search_method = '\b';
      }
      else if (((20000 < (cpi->rc).max_block_source_sad) &&
               ((5 < speed && (100 < (cpi->rc).frame_source_sad)))) &&
              ((1 < (cpi->rc).percent_blocks_with_motion ||
               ((cpi->svc).last_layer_dropped[0] == true)))) {
        (cpi->sf).mv_sf.search_method = '\x01';
        (cpi->sf).rt_sf.fullpel_search_step_param = 2;
      }
      if ((iVar13 != 0) && ((pAVar6->rtc_ref).non_reference_frame != 0)) {
        (cpi->sf).rt_sf.use_idtx_nonrd = 0;
        (cpi->sf).rt_sf.prefer_large_partition_blocks = 1;
        (cpi->sf).mv_sf.subpel_search_method = '\x02';
        (cpi->sf).rt_sf.fullpel_search_step_param = 10;
      }
      (cpi->sf).rt_sf.partition_direct_merging = 0;
      (cpi->sf).hl_sf.accurate_bit_estimate = 0;
      (cpi->sf).rt_sf.estimate_motion_for_var_based_partition =
           (uint)((cpi->sf).rt_sf.use_nonrd_pick_mode != 0);
    }
    if (((cpi->oxcf).rc_cfg.best_allowed_q == 0) && ((cpi->oxcf).rc_cfg.worst_allowed_q == 0)) {
      (cpi->sf).rt_sf.use_rtc_tf = 0;
      (cpi->sf).hl_sf.accurate_bit_estimate = 0;
    }
    if ((cpi->oxcf).use_highbitdepth == true) {
      (cpi->sf).rt_sf.estimate_motion_for_var_based_partition = 0;
    }
    if ((cpi->oxcf).superres_cfg.enable_superres == true) {
      (cpi->sf).rt_sf.use_rtc_tf = 0;
      (cpi->sf).rt_sf.nonrd_prune_ref_frame_search = 1;
    }
    if (((((pAVar6->b_calculate_psnr != 0) && ((cpi->oxcf).pass != AOM_RC_FIRST_PASS)) &&
         (cpi->compressor_stage != '\x01')) &&
        (((cpi->common).show_frame != 0 && (cpi->is_dropped_frame == false)))) &&
       (((cpi->oxcf).frm_dim_cfg.width != (cpi->common).width ||
        ((cpi->oxcf).frm_dim_cfg.height != (cpi->common).height)))) {
      (cpi->sf).rt_sf.use_rtc_tf = 0;
    }
  }
LAB_0022707c:
  if (cpi->ppi->seq_params_locked == 0) {
    pSVar7 = (cpi->common).seq_params;
    pSVar7->enable_masked_compound =
         pSVar7->enable_masked_compound & (cpi->sf).inter_sf.disable_masked_comp == 0;
    bVar8 = pSVar7->enable_interintra_compound & 1;
    if ((cpi->sf).inter_sf.disable_interintra_wedge_var_thresh == 0xffffffff) {
      bVar8 = 0;
    }
    pSVar7->enable_interintra_compound = bVar8;
  }
  uVar18 = (cpi->oxcf).unit_test_cfg.motion_vector_unit_test;
  (cpi->mv_search_params).find_fractional_mv_step =
       fractional_mv_search[(cpi->sf).mv_sf.subpel_search_method];
  if (uVar18 == 1) {
    pcVar10 = av1_return_max_sub_pixel_mv;
  }
  else {
    if (uVar18 != 2) goto LAB_002270f3;
    pcVar10 = av1_return_min_sub_pixel_mv;
  }
  (cpi->mv_search_params).find_fractional_mv_step = pcVar10;
LAB_002270f3:
  if ((((cpi->oxcf).row_mt == true) && (1 < (cpi->mt_info).num_workers)) &&
     ((cpi->sf).inter_sf.mv_cost_upd_level == INTERNAL_COST_UPD_SBROW_SET)) {
    (cpi->sf).inter_sf.mv_cost_upd_level = INTERNAL_COST_UPD_SBROW;
  }
  return;
}

Assistant:

void av1_set_speed_features_framesize_dependent(AV1_COMP *cpi, int speed) {
  SPEED_FEATURES *const sf = &cpi->sf;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;

  switch (oxcf->mode) {
    case GOOD:
      set_good_speed_feature_framesize_dependent(cpi, sf, speed);
      break;
    case ALLINTRA:
      set_allintra_speed_feature_framesize_dependent(cpi, sf, speed);
      break;
    case REALTIME:
      set_rt_speed_feature_framesize_dependent(cpi, sf, speed);
      break;
  }

  if (!cpi->ppi->seq_params_locked) {
    cpi->common.seq_params->enable_masked_compound &=
        !sf->inter_sf.disable_masked_comp;
    cpi->common.seq_params->enable_interintra_compound &=
        (sf->inter_sf.disable_interintra_wedge_var_thresh != UINT_MAX);
  }

  set_subpel_search_method(&cpi->mv_search_params,
                           cpi->oxcf.unit_test_cfg.motion_vector_unit_test,
                           sf->mv_sf.subpel_search_method);

  // For multi-thread use case with row_mt enabled, cost update for a set of
  // SB rows is not desirable. Hence, the sf mv_cost_upd_level is set to
  // INTERNAL_COST_UPD_SBROW in such cases.
  if ((cpi->oxcf.row_mt == 1) && (cpi->mt_info.num_workers > 1)) {
    if (sf->inter_sf.mv_cost_upd_level == INTERNAL_COST_UPD_SBROW_SET) {
      // Set mv_cost_upd_level to use row level update.
      sf->inter_sf.mv_cost_upd_level = INTERNAL_COST_UPD_SBROW;
    }
  }
}